

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

float __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::readDepth
          (GLFrameBuffer *this,int xPos,int yPos)

{
  float result;
  float local_1c;
  
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
  (*glad_glReadPixels)(xPos,yPos,1,1,0x1902,0x1406,&local_1c);
  return local_1c;
}

Assistant:

float GLFrameBuffer::readDepth(int xPos, int yPos) {

  // TODO does no error checking for the case where no depth buffer is attached

  glFlush();
  glFinish();
  bind();

  // Read from the buffer
  float result;
  glReadPixels(xPos, yPos, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &result);

  return result;
}